

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O2

int __thiscall Fossilize::FeatureFilter::Impl::init(Impl *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  undefined8 extraout_RAX;
  uint in_ECX;
  long in_RDX;
  ulong uVar2;
  void *in_R8;
  void *in_R9;
  allocator local_65;
  uint32_t local_64;
  void *local_60;
  void *local_58;
  value_type local_50;
  
  local_64 = (uint32_t)ctx;
  local_60 = in_R8;
  local_58 = in_R9;
  for (uVar2 = 0; in_ECX != uVar2; uVar2 = uVar2 + 1) {
    std::__cxx11::string::string((string *)&local_50,*(char **)(in_RDX + uVar2 * 8),&local_65);
    std::__detail::
    _Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)this,&local_50);
    std::__cxx11::string::_M_dispose();
    iVar1 = strcmp(*(char **)(in_RDX + uVar2 * 8),"VK_EXT_scalar_block_layout");
    if (iVar1 == 0) {
      (this->features).vk12.scalarBlockLayout = 1;
    }
  }
  this->api_version = local_64;
  memcpy(&this->props2,local_58,0x348);
  memcpy(&this->features2,local_60,0xf0);
  init_features(this,*(void **)((long)local_60 + 8));
  init_properties(this,*(void **)((long)local_58 + 8));
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

bool FeatureFilter::Impl::init(uint32_t api_version_, const char **device_exts, unsigned count,
                               const VkPhysicalDeviceFeatures2 *enabled_features,
                               const VkPhysicalDeviceProperties2 *properties)
{
	for (unsigned i = 0; i < count; i++)
	{
		enabled_extensions.insert(device_exts[i]);
		if (strcmp(device_exts[i], VK_EXT_SCALAR_BLOCK_LAYOUT_EXTENSION_NAME) == 0)
			features.vk12.scalarBlockLayout = VK_TRUE;
	}

	api_version = api_version_;
	props2 = *properties;
	features2 = *enabled_features;

	init_features(enabled_features->pNext);
	init_properties(properties->pNext);

	return true;
}